

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layout_handle
          (Impl *this,Value *state,VkPipelineLayout *out_layout)

{
  Ch *str;
  iterator iVar1;
  uint64_t layout;
  Hash local_18;
  
  str = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(state);
  local_18 = string_to_uint64(str);
  if (local_18 == 0) {
    *out_layout = (VkPipelineLayout)0x0;
  }
  else {
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->replayed_pipeline_layouts)._M_h,&local_18);
    if ((iVar1.
         super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>.
         _M_cur == (__node_type *)0x0) ||
       (*(VkPipelineLayout *)
         ((long)iVar1.
                super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>
                ._M_cur + 0x10) == (VkPipelineLayout)0x0)) {
      log_missing_resource("Pipeline layout",local_18);
      return false;
    }
    *out_layout = *(VkPipelineLayout *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>
                          ._M_cur + 0x10);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layout_handle(const Value &state, VkPipelineLayout *out_layout)
{
	auto layout = string_to_uint64(state.GetString());
	if (layout > 0)
	{
		auto layout_itr = replayed_pipeline_layouts.find(layout);
		if (layout_itr == end(replayed_pipeline_layouts) || layout_itr->second == VK_NULL_HANDLE)
		{
			log_missing_resource("Pipeline layout", layout);
			return false;
		}
		else
			*out_layout = layout_itr->second;
	}
	else
		*out_layout = VK_NULL_HANDLE;

	return true;
}